

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate1<float>::apply
          (QGate1<float> *this,Side side,Op op,int nbQubits,SquareMatrix<float> *matrix,int offset)

{
  long i_00;
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  float *pfVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  float fVar11;
  float x2_1;
  float x1_1;
  int64_t i2;
  int64_t i1;
  int64_t i_1;
  int64_t k_1;
  int64_t j_1;
  int64_t nRight_1;
  int64_t nLeft_1;
  SquareMatrix<float> local_98;
  float local_88;
  float local_84;
  float x2;
  float x1;
  int64_t j2;
  int64_t j1;
  int64_t j;
  int64_t k;
  int64_t i;
  int64_t nRight;
  int64_t nLeft;
  undefined1 local_38 [8];
  SquareMatrix<float> mat1;
  int qubit;
  int offset_local;
  SquareMatrix<float> *matrix_local;
  int nbQubits_local;
  Op op_local;
  Side side_local;
  QGate1<float> *this_local;
  
  mat1.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_ = offset;
  if (nbQubits < 1) {
    __assert_fail("nbQubits >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x1f,
                  "virtual void qclab::qgates::QGate1<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  iVar5 = dense::SquareMatrix<float>::size(matrix);
  bVar9 = (byte)nbQubits;
  if (iVar5 != 1 << (bVar9 & 0x1f)) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x20,
                  "virtual void qclab::qgates::QGate1<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  iVar4 = (*(this->super_QObject<float>)._vptr_QObject[3])();
  mat1.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl._0_4_ =
       iVar4 + mat1.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_;
  if (nbQubits <=
      (int)mat1.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl) {
    __assert_fail("qubit < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x22,
                  "virtual void qclab::qgates::QGate1<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  (*(this->super_QObject<float>)._vptr_QObject[7])();
  dense::operateInPlace<qclab::dense::SquareMatrix<float>>(op,(SquareMatrix<float> *)local_38);
  bVar10 = (byte)(int)mat1.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                      _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                      super__Head_base<0UL,_float_*,_false>._M_head_impl;
  if (side == Left) {
    if (nbQubits == 1) {
      dense::SquareMatrix<float>::operator*=(matrix,(SquareMatrix<float> *)local_38);
    }
    else {
      nRight = (int64_t)(1 << (bVar10 & 0x1f));
      i = (int64_t)(1 << ((bVar9 - bVar10) - 1 & 0x1f));
      for (k = 0; iVar5 = k, iVar6 = dense::SquareMatrix<float>::rows(matrix), iVar5 < iVar6;
          k = k + 1) {
        for (j = 0; j < nRight; j = j + 1) {
          for (j1 = 0; j1 < i; j1 = j1 + 1) {
            j2 = j1 + j * i * 2;
            _x2 = j2 + i;
            pfVar7 = dense::SquareMatrix<float>::operator()(matrix,k,j2);
            local_84 = *pfVar7;
            pfVar7 = dense::SquareMatrix<float>::operator()(matrix,k,_x2);
            local_88 = *pfVar7;
            pfVar7 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_38,0,0);
            fVar2 = local_84;
            fVar1 = *pfVar7;
            pfVar7 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_38,1,0);
            fVar11 = *pfVar7 * local_88;
            pfVar7 = dense::SquareMatrix<float>::operator()(matrix,k,j2);
            *pfVar7 = fVar1 * fVar2 + fVar11;
            pfVar7 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_38,0,1);
            fVar2 = local_84;
            fVar1 = *pfVar7;
            pfVar7 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_38,1,1);
            fVar11 = *pfVar7 * local_88;
            pfVar7 = dense::SquareMatrix<float>::operator()(matrix,k,_x2);
            *pfVar7 = fVar1 * fVar2 + fVar11;
          }
        }
      }
    }
  }
  else if (nbQubits == 1) {
    dense::SquareMatrix<float>::SquareMatrix
              ((SquareMatrix<float> *)&nLeft_1,(SquareMatrix<float> *)local_38);
    dense::operator*((dense *)&local_98,(SquareMatrix<float> *)&nLeft_1,matrix);
    dense::SquareMatrix<float>::operator=(matrix,&local_98);
    dense::SquareMatrix<float>::~SquareMatrix(&local_98);
    dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&nLeft_1);
  }
  else {
    lVar8 = (long)(1 << ((bVar9 - bVar10) - 1 & 0x1f));
    for (k_1 = 0; iVar5 = dense::SquareMatrix<float>::cols(matrix), k_1 < iVar5; k_1 = k_1 + 1) {
      for (i_1 = 0; i_1 < 1 << (bVar10 & 0x1f); i_1 = i_1 + 1) {
        for (i1 = 0; i1 < lVar8; i1 = i1 + 1) {
          i_00 = i1 + i_1 * lVar8 * 2;
          pfVar7 = dense::SquareMatrix<float>::operator()(matrix,i_00,k_1);
          fVar1 = *pfVar7;
          pfVar7 = dense::SquareMatrix<float>::operator()(matrix,i_00 + lVar8,k_1);
          fVar2 = *pfVar7;
          pfVar7 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_38,0,0);
          fVar11 = *pfVar7;
          pfVar7 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_38,0,1);
          fVar3 = *pfVar7;
          pfVar7 = dense::SquareMatrix<float>::operator()(matrix,i_00,k_1);
          *pfVar7 = fVar11 * fVar1 + fVar3 * fVar2;
          pfVar7 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_38,1,0);
          fVar11 = *pfVar7;
          pfVar7 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_38,1,1);
          fVar3 = *pfVar7;
          pfVar7 = dense::SquareMatrix<float>::operator()(matrix,i_00 + lVar8,k_1);
          *pfVar7 = fVar11 * fVar1 + fVar3 * fVar2;
        }
      }
    }
  }
  dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_38);
  return;
}

Assistant:

QGate1( const int qubit )
        : qubit_( qubit )
        {
          assert( qubit >= 0 ) ;
        }